

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O0

string * __thiscall
viennamath::rt_latex_translator<viennamath::rt_expression_interface<double>>::operator()[abi_cxx11_
          (string *__return_storage_ptr__,
          rt_latex_translator<viennamath::rt_expression_interface<double>> *this,Interval *e,
          bool use_parenthesis)

{
  ostream *poVar1;
  rt_expr<viennamath::rt_expression_interface<double>_> *prVar2;
  string local_200;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [383];
  undefined1 local_21;
  Interval *pIStack_20;
  bool use_parenthesis_local;
  Interval *e_local;
  rt_latex_translator<viennamath::rt_expression_interface<double>_> *this_local;
  
  local_21 = use_parenthesis;
  pIStack_20 = e;
  e_local = (Interval *)this;
  this_local = (rt_latex_translator<viennamath::rt_expression_interface<double>_> *)
               __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0," [ ");
  prVar2 = rt_interval<viennamath::rt_expression_interface<double>_>::lower(pIStack_20);
  operator()[abi_cxx11_(&local_1e0,this,prVar2,false);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"; ");
  prVar2 = rt_interval<viennamath::rt_expression_interface<double>_>::upper(pIStack_20);
  operator()[abi_cxx11_(&local_200,this,prVar2,false);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  std::operator<<(poVar1," ] ");
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(Interval   const & e, bool use_parenthesis = false) const
      {
        std::stringstream ss;
        ss << " [ " << operator()(e.lower()) << "; " << operator()(e.upper()) << " ] ";
        (void)use_parenthesis; //to silence unused parameter warnings
        return ss.str();
      }